

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nestl_test.hpp
# Opt level: O0

void nestl::test::detail::
     print_tuple<char_const(&)[44],unsigned_long&,char_const(&)[16],unsigned_long&,char_const(&)[10]>
               (ostream *ostream,char (*args) [44],unsigned_long *args_1,char (*args_2) [16],
               unsigned_long *args_3,char (*args_4) [10])

{
  tuple<const_char_*,_unsigned_long,_const_char_*,_unsigned_long,_const_char_*> local_60;
  char (*local_38) [10];
  char (*args_local_4) [10];
  unsigned_long *args_local_3;
  char (*args_local_2) [16];
  unsigned_long *args_local_1;
  char (*args_local) [44];
  ostream *ostream_local;
  
  local_38 = args_4;
  args_local_4 = (char (*) [10])args_3;
  args_local_3 = (unsigned_long *)args_2;
  args_local_2 = (char (*) [16])args_1;
  args_local_1 = (unsigned_long *)args;
  args_local = (char (*) [44])ostream;
  std::
  make_tuple<char_const(&)[44],unsigned_long&,char_const(&)[16],unsigned_long&,char_const(&)[10]>
            (&local_60,args,args_1,args_2,args_3,args_4);
  print_tuple_impl<char,std::char_traits<char>,std::tuple<char_const*,unsigned_long,char_const*,unsigned_long,char_const*>,0ul,1ul,2ul,3ul,4ul>
            (ostream,&local_60);
  return;
}

Assistant:

void print_tuple(std::ostream& ostream, Args&&... args)
{
    print_tuple_impl(ostream, std::make_tuple(args...), gen_seq<sizeof...(Args)>());
}